

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

void __thiscall
arangodb::velocypack::Validator::validateArray(Validator *this,uint8_t *ptr,size_t length)

{
  uint8_t uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  ValueLength VVar4;
  Exception *pEVar5;
  byte bVar6;
  unsigned_long uVar7;
  long lVar8;
  Validator *pVVar9;
  char *pcVar10;
  uint8_t *puVar11;
  size_t length_00;
  Validator *ptr_00;
  long lVar12;
  ulong uVar13;
  unsigned_long uVar14;
  Validator *pVVar15;
  unsigned_long uVar16;
  unsigned_long uVar17;
  ValueLength VVar18;
  bool bVar19;
  unsigned_long uStack_48;
  Validator *pVStack_40;
  Validator *pVStack_38;
  
  uVar1 = *ptr;
  if (uVar1 == '\x13') {
    validateBufferLength(this,4,length,true);
    pVStack_40 = (Validator *)(ptr + 1);
    VVar18 = ReadVariableLengthValue<false>((uint8_t **)&pVStack_40,ptr + length + 1);
    pVVar9 = pVStack_40;
    if ((VVar18 <= length) && (3 < VVar18)) {
      pVStack_40 = (Validator *)(ptr + (VVar18 - 1));
      VVar18 = ReadVariableLengthValue<true>((uint8_t **)&pVStack_40,ptr + VVar18);
      if (VVar18 != 0) {
        pVVar15 = (Validator *)((long)&pVStack_40->options + 1);
        while( true ) {
          bVar19 = VVar18 == 0;
          VVar18 = VVar18 - 1;
          if (bVar19) {
            return;
          }
          if (pVVar15 <= pVVar9) break;
          validatePart(this,(uint8_t *)pVVar9,(long)pVVar15 - (long)pVVar9,true);
          pVStack_38 = pVVar9;
          VVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                             &pVStack_38);
          pVVar9 = (Validator *)((long)&pVVar9->options + VVar4);
        }
        pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar10 = "Array items number is out of bounds";
        goto LAB_00109ab2;
      }
    }
    pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar10 = "Array length value is out of bounds";
LAB_00109ab2:
    Exception::Exception(pEVar5,ValidatorInvalidLength,pcVar10);
    __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
  }
  if ((byte)(uVar1 - 2) < 4) {
    VVar18 = 1L << (*ptr - 2 & 0x3f);
    validateBufferLength(this,VVar18 + 2,length,true);
    uVar2 = readIntegerNonEmpty<unsigned_long>(ptr + 1,VVar18);
    if (length < uVar2) {
      pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar10 = "Array length is out of bounds";
    }
    else {
      uVar14 = VVar18 + 1;
      uVar3 = 9;
      if ((long)uVar2 < 9) {
        uVar3 = uVar2;
      }
      uVar7 = uVar14;
      uVar16 = uVar14;
      if ((long)uVar14 < (long)uVar3) {
        uVar16 = uVar3;
      }
      for (; (uVar17 = uVar16, (long)uVar7 < (long)uVar3 && (uVar17 = uVar7, ptr[uVar7] == '\0'));
          uVar7 = uVar7 + 1) {
      }
      uVar13 = uVar2 - uVar17;
      if (uVar13 == 0 || (long)uVar2 < (long)uVar17) {
        pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar10 = "Array structure is invalid";
      }
      else if (uVar17 == 9 || uVar17 == uVar14) {
        validatePart(this,ptr + uVar17,length - uVar17,true);
        pVStack_40 = (Validator *)(ptr + uVar17);
        VVar18 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                           ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                            &pVStack_40);
        if (VVar18 == 0) {
          pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
          pcVar10 = "Array itemSize value is invalid";
        }
        else if (uVar13 < VVar18) {
          pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
          pcVar10 = "Array nrItems value is invalid";
        }
        else {
          uVar13 = uVar13 / VVar18;
          pVStack_38 = (Validator *)(ptr + length);
          pVVar9 = (Validator *)(ptr + uVar17 + VVar18);
          length_00 = length - (uVar17 + VVar18);
          do {
            uVar13 = uVar13 - 1;
            if (uVar13 == 0) {
              return;
            }
            if (pVStack_38 <= pVVar9) {
              pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
              pcVar10 = "Array value is out of bounds";
              goto LAB_00109c4b;
            }
            validatePart(this,(uint8_t *)pVVar9,length_00,true);
            pVStack_40 = pVVar9;
            VVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                *)&pVStack_40);
            pVVar9 = (Validator *)((long)&pVVar9->options + VVar18);
            length_00 = length_00 - VVar18;
          } while (VVar4 == VVar18);
          pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
          pcVar10 = "Unexpected Array value length";
        }
      }
      else {
        pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar10 = "Array padding is invalid";
      }
    }
LAB_00109c4b:
    Exception::Exception(pEVar5,ValidatorInvalidLength,pcVar10);
    __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
  }
  if (3 < (byte)(uVar1 - 6)) {
    return;
  }
  uVar1 = *ptr;
  bVar6 = uVar1 - 6;
  VVar18 = 1L << (bVar6 & 0x3f);
  pVStack_40 = this;
  validateBufferLength(this,(2L << (bVar6 & 0x3f)) + 2,length,true);
  puVar11 = ptr + 1;
  uVar2 = readIntegerNonEmpty<unsigned_long>(puVar11,VVar18);
  if (length < uVar2) {
    pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar10 = "Array length is out of bounds";
    goto LAB_00109ea6;
  }
  if (uVar1 == '\t') {
    uStack_48 = readIntegerNonEmpty<unsigned_long>(ptr + (uVar2 - VVar18),VVar18);
    if (uStack_48 == 0) {
LAB_00109edb:
      pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar10 = "Array nrItems value is invalid";
      goto LAB_00109ea6;
    }
    pVVar15 = (Validator *)(ptr + (uVar2 - VVar18) + -(uStack_48 << (bVar6 & 0x3f)));
    if ((pVVar15 < (Validator *)(ptr + VVar18)) ||
       ((Validator *)(ptr + VVar18 * -2 + length) < pVVar15)) {
LAB_00109eef:
      pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar10 = "Array index table is out of bounds";
      goto LAB_00109ea6;
    }
    ptr_00 = (Validator *)(puVar11 + VVar18);
  }
  else {
    puVar11 = puVar11 + VVar18;
    uStack_48 = readIntegerNonEmpty<unsigned_long>(puVar11,VVar18);
    if (uStack_48 == 0) goto LAB_00109edb;
    lVar12 = -2L << (bVar6 & 0x3f);
    pVVar15 = (Validator *)(ptr + uVar2);
    pVVar9 = (Validator *)(puVar11 + lVar12 + VVar18 + 8);
    if (pVVar15 < (Validator *)(puVar11 + lVar12 + VVar18 + 8)) {
      pVVar9 = pVVar15;
    }
    lVar8 = 0;
    while ((ptr_00 = (Validator *)(puVar11 + lVar8 + VVar18), ptr_00 < pVVar9 &&
           (*(uint8_t *)&ptr_00->options == '\0'))) {
      lVar8 = lVar8 + 1;
    }
    if ((lVar8 != 0) && (lVar12 + 8 != lVar8)) {
      pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar10 = "Array padding is invalid";
      goto LAB_00109ea6;
    }
    pVVar15 = (Validator *)((long)pVVar15 - (uStack_48 << (bVar6 & 0x3f)));
    if (((pVVar15 < (Validator *)(ptr + VVar18 * 2)) || (pVVar15 < ptr_00)) ||
       ((Validator *)(ptr + (length - VVar18)) < pVVar15)) goto LAB_00109eef;
  }
  uVar2 = 0;
  for (; ptr_00 < pVVar15; ptr_00 = (Validator *)((long)&ptr_00->options + VVar4)) {
    validatePart(pVStack_40,(uint8_t *)ptr_00,(long)pVVar15 - (long)ptr_00,true);
    uVar3 = readIntegerNonEmpty<unsigned_long>
                      ((uint8_t *)((long)&pVVar15->options + (uVar2 << (bVar6 & 0x3f))),VVar18);
    if (uVar3 != (long)ptr_00 - (long)ptr) {
      pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar10 = "Array index table is wrong";
      goto LAB_00109ea6;
    }
    pVStack_38 = ptr_00;
    VVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &pVStack_38);
    uVar2 = uVar2 + 1;
  }
  if (uStack_48 == uVar2) {
    return;
  }
  pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
  pcVar10 = "Array has more items than in index";
LAB_00109ea6:
  Exception::Exception(pEVar5,ValidatorInvalidLength,pcVar10);
  __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateArray(uint8_t const* ptr, std::size_t length) {
  uint8_t head = *ptr;

  if (head == 0x13U) {
    // compact array
    validateCompactArray(ptr, length);
  } else if (head >= 0x02U && head <= 0x05U) {
    // array without index table
    validateUnindexedArray(ptr, length);
  } else if (head >= 0x06U && head <= 0x09U) {
    // array with index table
    validateIndexedArray(ptr, length);
  } else if (head == 0x01U) {
    // empty array. always valid
  }
}